

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::visitSymbol
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  TIntermediate *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  StorageClass SVar4;
  Id IVar5;
  undefined4 extraout_var;
  TSourceLoc *this_01;
  char *pcVar6;
  long *plVar7;
  ulong uVar8;
  mapped_type mVar9;
  mapped_type *pmVar10;
  TQualifier *pTVar11;
  TType *pTVar12;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_02;
  size_type sVar13;
  SpvVersion *pSVar14;
  long lVar15;
  void *__src;
  TString *name;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar16;
  mapped_type *ppTVar17;
  pointer ppVar18;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar19;
  byte local_169;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
  _Stack_138;
  Id counterId;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
  local_130;
  iterator it;
  undefined1 local_120 [8];
  string keyName_1;
  allocator<char> local_d9;
  undefined1 local_d8 [8];
  string keyName;
  key_type local_b0;
  _Node_iterator_base<long_long,_false> local_a8;
  undefined1 local_a0 [8];
  TQualifier qualifier;
  Id local_38;
  StorageClass sc;
  Id id;
  undefined1 local_28 [8];
  SpecConstantOpModeGuard spec_constant_op_mode_setter;
  TIntermSymbol *symbol_local;
  TGlslangToSpvTraverser *this_local;
  
  spec_constant_op_mode_setter._8_8_ = symbol;
  if ((this->linkageOnly & 1U) == 0) {
    iVar3 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
    iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0xc);
    this_01 = (TSourceLoc *)(*(code *)**(undefined8 **)spec_constant_op_mode_setter._8_8_)();
    pcVar6 = glslang::TSourceLoc::getFilename(this_01);
    spv::Builder::setDebugSourceLocation(&this->builder,iVar3,pcVar6);
  }
  iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
  if (iVar3 == 0x16) {
    return;
  }
  anon_unknown_0::SpecConstantOpModeGuard::SpecConstantOpModeGuard
            ((SpecConstantOpModeGuard *)local_28,&this->builder);
  plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  uVar8 = (**(code **)(*plVar7 + 0x128))();
  if ((uVar8 & 1) != 0) {
    mVar9 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x180))();
    pTVar12 = (TType *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    _id = glslang::TType::getStruct(pTVar12);
    pmVar10 = std::
              unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_long_long,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>_>
              ::operator[](&this->glslangTypeToIdMap,(key_type *)&id);
    *pmVar10 = mVar9;
  }
  plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  pTVar11 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
  bVar2 = glslang::TQualifier::isSpecConstant(pTVar11);
  if (bVar2) {
    anon_unknown_0::SpecConstantOpModeGuard::turnOnSpecConstantOpMode
              ((SpecConstantOpModeGuard *)local_28);
  }
  iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
  if (iVar3 == 0x1b) {
    sc = Input;
    goto LAB_00687173;
  }
  local_38 = getSymbolId(this,(TIntermSymbol *)spec_constant_op_mode_setter._8_8_);
  plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  pTVar11 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
  bVar2 = glslang::TQualifier::isTaskPayload(pTVar11);
  if (bVar2) {
    this->taskPayloadID = local_38;
  }
  bVar2 = spv::Builder::isPointer(&this->builder,local_38);
  if (bVar2) {
    plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    pTVar11 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
    bVar2 = glslang::TQualifier::isParamInput(pTVar11);
    if (!bVar2) {
      plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
      pTVar11 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
      bVar2 = glslang::TQualifier::isParamOutput(pTVar11);
      if (!bVar2) {
        plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
        uVar8 = (**(code **)(*plVar7 + 0x128))();
        if ((uVar8 & 1) != 0) {
          pTVar12 = (TType *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
          this_02 = &glslang::TType::getStruct(pTVar12)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          sVar13 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                             (this_02);
          if (sVar13 == 0) goto LAB_00686d3d;
        }
        SVar4 = spv::Builder::getStorageClass(&this->builder,local_38);
        pSVar14 = glslang::TIntermediate::getSpv(this->glslangIntermediate);
        if ((((0x103ff < pSVar14->spv) &&
             (bVar2 = spv::Builder::isGlobalVariable(&this->builder,local_38), bVar2)) ||
            (SVar4 == Input)) || (SVar4 == Output)) {
          pVar19 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   insert(&this->iOSet,&local_38);
          qualifier._72_8_ = pVar19.first._M_node;
        }
      }
    }
LAB_00686d3d:
    plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    lVar15 = (**(code **)(*plVar7 + 0x58))();
    if (((uint)*(undefined8 *)(lVar15 + 8) & 0x7f) == 3) {
      local_38 = translateForcedType(this,local_38);
    }
  }
  if ((this->linkageOnly & 1U) == 0) {
LAB_00686da2:
    spv::Builder::clearAccessChain(&this->builder);
    __src = (void *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x108))();
    memcpy(local_a0,__src,0x50);
    bVar2 = glslang::TQualifier::isSpecConstant((TQualifier *)local_a0);
    local_169 = 1;
    if (!bVar2) {
      local_b0 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x180))();
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
           ::find(&this->rValueParameters,&local_b0);
      keyName.field_2._8_8_ =
           std::
           unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
           ::end(&this->rValueParameters);
      bVar2 = std::__detail::operator!=
                        (&local_a8,
                         (_Node_iterator_base<long_long,_false> *)((long)&keyName.field_2 + 8));
      local_169 = 1;
      if (!bVar2) {
        IVar5 = spv::Builder::getTypeId(&this->builder,local_38);
        bVar2 = spv::Builder::isPointerType(&this->builder,IVar5);
        local_169 = bVar2 ^ 0xff;
      }
    }
    if ((local_169 & 1) == 0) {
      spv::Builder::setAccessChainLValue(&this->builder,local_38);
    }
    else {
      spv::Builder::setAccessChainRValue(&this->builder,local_38);
    }
  }
  else {
    pTVar11 = (TQualifier *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x108))();
    bVar2 = glslang::TQualifier::isSpecConstant(pTVar11);
    if (bVar2) goto LAB_00686da2;
  }
  if (((this->linkageOnly & 1U) != 0) &&
     (bVar2 = glslang::TIntermediate::getHlslFunctionality1(this->glslangIntermediate), bVar2)) {
    plVar7 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    pTVar11 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
    bVar2 = glslang::TQualifier::isUniformOrBuffer(pTVar11);
    if (bVar2) {
      this_00 = this->glslangIntermediate;
      name = (TString *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 400))();
      bVar2 = glslang::TIntermediate::hasCounterBufferName(this_00,name);
      if (bVar2) {
        pbVar16 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 400))();
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (pbVar16);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,pcVar6,
                   (allocator<char> *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
                           ._M_cur + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
                           ._M_cur + 7));
        local_130._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>_>
             ::find(&this->counterOriginator,(key_type *)local_120);
        _Stack_138._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>_>
             ::end(&this->counterOriginator);
        bVar2 = std::__detail::operator!=(&local_130,&stack0xfffffffffffffec8);
        if (bVar2) {
          ppVar18 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_false,_true>
                                  *)&local_130);
          local_38 = getSymbolId(this,ppVar18->second);
          if ((local_38 != 0) &&
             (IVar5 = getSymbolId(this,(TIntermSymbol *)spec_constant_op_mode_setter._8_8_),
             IVar5 != 0)) {
            spv::Builder::addExtension(&this->builder,"SPV_GOOGLE_hlsl_functionality1");
            spv::Builder::addDecorationId(&this->builder,local_38,CounterBuffer,IVar5);
          }
        }
        std::__cxx11::string::~string((string *)local_120);
      }
      else {
        pbVar16 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 400))();
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (pbVar16);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,pcVar6,&local_d9);
        std::allocator<char>::~allocator(&local_d9);
        glslang::TIntermediate::addCounterBufferName<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&keyName_1.field_2 + 8),this->glslangIntermediate,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        std::__cxx11::string::operator=
                  ((string *)local_d8,(string *)(keyName_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(keyName_1.field_2._M_local_buf + 8));
        uVar1 = spec_constant_op_mode_setter._8_8_;
        ppTVar17 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>_>
                   ::operator[](&this->counterOriginator,(key_type *)local_d8);
        *ppTVar17 = (mapped_type)uVar1;
        std::__cxx11::string::~string((string *)local_d8);
      }
    }
  }
  sc = StorageClassUniformConstant;
LAB_00687173:
  anon_unknown_0::SpecConstantOpModeGuard::~SpecConstantOpModeGuard
            ((SpecConstantOpModeGuard *)local_28);
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitSymbol(glslang::TIntermSymbol* symbol)
{
    // We update the line information even though no code might be generated here
    // This is helpful to yield correct lines for control flow instructions
    if (!linkageOnly) {
        builder.setDebugSourceLocation(symbol->getLoc().line, symbol->getLoc().getFilename());
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return;
    }

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (symbol->getType().isStruct())
        glslangTypeToIdMap[symbol->getType().getStruct()] = symbol->getId();

    if (symbol->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
#ifdef ENABLE_HLSL
    // Skip symbol handling if it is string-typed
    if (symbol->getBasicType() == glslang::EbtString)
        return;
#endif

    // getSymbolId() will set up all the IO decorations on the first call.
    // Formal function parameters were mapped during makeFunctions().
    spv::Id id = getSymbolId(symbol);

    if (symbol->getType().getQualifier().isTaskPayload())
        taskPayloadID = id; // cache the taskPayloadID to be used it as operand for OpEmitMeshTasksEXT

    if (builder.isPointer(id)) {
        if (!symbol->getType().getQualifier().isParamInput() &&
            !symbol->getType().getQualifier().isParamOutput()) {
            // Include all "static use" and "linkage only" interface variables on the OpEntryPoint instruction
            // Consider adding to the OpEntryPoint interface list.
            // Only looking at structures if they have at least one member.
            if (!symbol->getType().isStruct() || symbol->getType().getStruct()->size() > 0) {
                spv::StorageClass sc = builder.getStorageClass(id);
                // Before SPIR-V 1.4, we only want to include Input and Output.
                // Starting with SPIR-V 1.4, we want all globals.
                if ((glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4 && builder.isGlobalVariable(id)) ||
                    (sc == spv::StorageClassInput || sc == spv::StorageClassOutput)) {
                    iOSet.insert(id);
                }
            }
        }

        // If the SPIR-V type is required to be different than the AST type
        // (for ex SubgroupMasks or 3x4 ObjectToWorld/WorldToObject matrices),
        // translate now from the SPIR-V type to the AST type, for the consuming
        // operation.
        // Note this turns it from an l-value to an r-value.
        // Currently, all symbols needing this are inputs; avoid the map lookup when non-input.
        if (symbol->getType().getQualifier().storage == glslang::EvqVaryingIn)
            id = translateForcedType(id);
    }

    // Only process non-linkage-only nodes for generating actual static uses
    if (! linkageOnly || symbol->getQualifier().isSpecConstant()) {
        // Prepare to generate code for the access

        // L-value chains will be computed left to right.  We're on the symbol now,
        // which is the left-most part of the access chain, so now is "clear" time,
        // followed by setting the base.
        builder.clearAccessChain();

        // For now, we consider all user variables as being in memory, so they are pointers,
        // except for
        // A) R-Value arguments to a function, which are an intermediate object.
        //    See comments in handleUserFunctionCall().
        // B) Specialization constants (normal constants don't even come in as a variable),
        //    These are also pure R-values.
        // C) R-Values from type translation, see above call to translateForcedType()
        glslang::TQualifier qualifier = symbol->getQualifier();
        if (qualifier.isSpecConstant() || rValueParameters.find(symbol->getId()) != rValueParameters.end() ||
            !builder.isPointerType(builder.getTypeId(id)))
            builder.setAccessChainRValue(id);
        else
            builder.setAccessChainLValue(id);
    }

#ifdef ENABLE_HLSL
    // Process linkage-only nodes for any special additional interface work.
    if (linkageOnly) {
        if (glslangIntermediate->getHlslFunctionality1()) {
            // Map implicit counter buffers to their originating buffers, which should have been
            // seen by now, given earlier pruning of unused counters, and preservation of order
            // of declaration.
            if (symbol->getType().getQualifier().isUniformOrBuffer()) {
                if (!glslangIntermediate->hasCounterBufferName(symbol->getName())) {
                    // Save possible originating buffers for counter buffers, keyed by
                    // making the potential counter-buffer name.
                    std::string keyName = symbol->getName().c_str();
                    keyName = glslangIntermediate->addCounterBufferName(keyName);
                    counterOriginator[keyName] = symbol;
                } else {
                    // Handle a counter buffer, by finding the saved originating buffer.
                    std::string keyName = symbol->getName().c_str();
                    auto it = counterOriginator.find(keyName);
                    if (it != counterOriginator.end()) {
                        id = getSymbolId(it->second);
                        if (id != spv::NoResult) {
                            spv::Id counterId = getSymbolId(symbol);
                            if (counterId != spv::NoResult) {
                                builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
                                builder.addDecorationId(id, spv::DecorationHlslCounterBufferGOOGLE, counterId);
                            }
                        }
                    }
                }
            }
        }
    }
#endif
}